

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O1

int check_matrix(SUNMatrix A,SUNMatrix B,realtype tol)

{
  double dVar1;
  double dVar2;
  SUNMatrix_ID SVar3;
  SUNMatrix_ID SVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  SVar3 = SUNMatGetID(A);
  SVar4 = SUNMatGetID(B);
  uVar12 = 1;
  if (SVar3 == SVar4) {
    lVar5 = SUNBandMatrix_Columns(A);
    lVar6 = SUNBandMatrix_Columns(B);
    if (lVar5 == lVar6) {
      lVar5 = SUNBandMatrix_Rows(A);
      lVar6 = SUNBandMatrix_Rows(B);
      if (lVar5 == lVar6) {
        lVar5 = SUNBandMatrix_LowerBandwidth(A);
        lVar6 = SUNBandMatrix_LowerBandwidth(B);
        if (lVar5 == lVar6) {
          lVar5 = SUNBandMatrix_UpperBandwidth(A);
          lVar6 = SUNBandMatrix_UpperBandwidth(B);
          if (lVar5 == lVar6) {
            lVar5 = SUNBandMatrix_Columns(A);
            uVar12 = 0;
            if (0 < lVar5) {
              uVar13 = 0;
              do {
                lVar5 = SUNBandMatrix_Column(A,uVar13);
                lVar6 = SUNBandMatrix_Column(B,uVar13);
                lVar7 = SUNBandMatrix_UpperBandwidth(A);
                uVar8 = uVar13;
                if (lVar7 <= (long)uVar13) {
                  uVar8 = SUNBandMatrix_UpperBandwidth(A);
                }
                lVar7 = SUNBandMatrix_Columns(A);
                uVar9 = SUNBandMatrix_LowerBandwidth(A);
                if ((long)(~uVar9 + lVar7) < (long)uVar13) {
                  lVar7 = SUNBandMatrix_Columns();
                  lVar7 = ~uVar13 + lVar7;
                }
                else {
                  lVar7 = SUNBandMatrix_LowerBandwidth(A);
                }
                lVar11 = -uVar8;
                if (SBORROW8(lVar7,lVar11) == (long)(lVar7 + uVar8) < 0) {
                  do {
                    dVar1 = *(double *)(lVar5 + lVar11 * 8);
                    if (NAN(dVar1)) {
                      uVar10 = 1;
                    }
                    else {
                      dVar2 = *(double *)(lVar6 + lVar11 * 8);
                      uVar10 = (uint)(tol < ABS((dVar1 - dVar2) / dVar2));
                    }
                    uVar12 = uVar12 + uVar10;
                    lVar11 = lVar11 + 1;
                  } while (lVar7 + 1 != lVar11);
                }
                uVar13 = uVar13 + 1;
                lVar5 = SUNBandMatrix_Columns(A);
              } while ((long)uVar13 < lVar5);
              uVar12 = (uint)(0 < (int)uVar12);
            }
            if ((char)uVar12 != '\0') {
              puts("check_matrix failure, A = ");
              SUNBandMatrix_Print(A,_stdout);
              puts("B = ");
              SUNBandMatrix_Print(B,_stdout);
            }
          }
        }
      }
    }
  }
  return uVar12;
}

Assistant:

int check_matrix(SUNMatrix A, SUNMatrix B, realtype tol)
{
  int failure = 0;
  sunindextype i, j, istart, iend;
  realtype *Acolj, *Bcolj;

  /* check matrix type and dimensions */
  if (SUNMatGetID(A) != SUNMatGetID(B))
    return 1;
  if (SUNBandMatrix_Columns(A) != SUNBandMatrix_Columns(B))
    return 1;
  if (SUNBandMatrix_Rows(A) != SUNBandMatrix_Rows(B))
    return 1;
  if (SUNBandMatrix_LowerBandwidth(A) != SUNBandMatrix_LowerBandwidth(B))
    return 1;
  if (SUNBandMatrix_UpperBandwidth(A) != SUNBandMatrix_UpperBandwidth(B))
    return 1;
  
  /* check matrix data */
  for (j=0; j<SUNBandMatrix_Columns(A); j++) {

    /* access matrix columns */
    Acolj = SUNBandMatrix_Column(A, j);
    Bcolj = SUNBandMatrix_Column(B, j);

    /* compare entries in this column */
    istart = (j<SUNBandMatrix_UpperBandwidth(A)) ? -j : -SUNBandMatrix_UpperBandwidth(A);
    iend = (j>SUNBandMatrix_Columns(A)-1-SUNBandMatrix_LowerBandwidth(A)) ?
      SUNBandMatrix_Columns(A)-1-j : SUNBandMatrix_LowerBandwidth(A);
    for (i=istart; i<=iend; i++)
      failure += FNEQ(Acolj[i], Bcolj[i], tol);
  }

  if (failure > ZERO) {
    printf("check_matrix failure, A = \n");
    SUNBandMatrix_Print(A, stdout);
    printf("B = \n");
    SUNBandMatrix_Print(B, stdout);
  }

    
  if (failure > ZERO)
    return(1);
  else
    return(0);
}